

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath1.0.c
# Opt level: O1

LY_ERR lyplg_type_xpath10_print_token
                 (char *token,uint16_t tok_len,ly_bool is_nametest,lys_module **context_mod,
                 ly_ctx *resolve_ctx,LY_VALUE_FORMAT resolve_format,void *resolve_prefix_data,
                 LY_VALUE_FORMAT get_format,void *get_prefix_data,char **token_p,ly_err_item **err)

{
  bool bVar1;
  LY_ERR LVar2;
  int iVar3;
  lys_module *mod;
  size_t sVar4;
  char *__s;
  char *pcVar5;
  undefined7 in_register_00000011;
  int iVar6;
  ulong uVar7;
  undefined6 in_register_00000032;
  ulong uVar8;
  uint uVar9;
  char *__ptr;
  ly_bool is_prefix;
  uint32_t len;
  char local_5d;
  uint local_5c;
  lys_module **local_58;
  LY_VALUE_FORMAT local_4c;
  char *str_next;
  ly_ctx *local_40;
  char *local_38;
  
  uVar8 = CONCAT71(in_register_00000011,is_nametest) & 0xffffffff;
  local_38 = token + (CONCAT62(in_register_00000032,tok_len) & 0xffffffff);
  local_58 = context_mod;
  local_4c = resolve_format;
  local_40 = resolve_ctx;
  LVar2 = ly_value_prefix_next(token,local_38,&len,&is_prefix,&str_next);
  if (len == 0 || LVar2 != LY_SUCCESS) {
    pcVar5 = (char *)0x0;
LAB_001c456e:
    if (LVar2 == LY_SUCCESS) {
      *token_p = pcVar5;
    }
    else {
      free(pcVar5);
    }
    return LVar2;
  }
  local_5d = (get_format & ~LY_VALUE_SCHEMA) == LY_VALUE_JSON && (char)uVar8 != '\0';
  uVar7 = 0;
  bVar1 = false;
  local_5c = (uint)CONCAT71(in_register_00000011,is_nametest);
  __ptr = (char *)0x0;
  do {
    iVar6 = (int)uVar7;
    pcVar5 = __ptr;
    if (is_prefix == '\0') {
      if ((((get_format != LY_VALUE_XML) || ((char)uVar8 == '\0')) || (bVar1)) ||
         (*local_58 == (lys_module *)0x0)) {
        pcVar5 = (char *)realloc(__ptr,(ulong)(len + iVar6 + 1));
        if (pcVar5 == (char *)0x0) {
          LVar2 = ly_err_new(err,LY_EMEM,LYVE_DATA,(char *)0x0,(char *)0x0,"No memory.");
          pcVar5 = __ptr;
          goto LAB_001c456e;
        }
        iVar3 = sprintf(pcVar5 + uVar7,"%.*s",(ulong)len,token);
        uVar7 = (ulong)(uint)(iVar3 + iVar6);
      }
      else {
        __s = lyplg_type_get_prefix(*local_58,LY_VALUE_XML,get_prefix_data);
        if (__s == (char *)0x0) {
          __assert_fail("prefix",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                        ,0x3c,
                        "LY_ERR lyplg_type_xpath10_print_token(const char *, uint16_t, ly_bool, const struct lys_module **, const struct ly_ctx *, LY_VALUE_FORMAT, const void *, LY_VALUE_FORMAT, void *, char **, struct ly_err_item **)"
                       );
        }
        sVar4 = strlen(__s);
        pcVar5 = (char *)realloc(__ptr,(ulong)len + sVar4 + uVar7 + 2);
        if (pcVar5 == (char *)0x0) goto LAB_001c4519;
        bVar1 = false;
        iVar3 = sprintf(pcVar5 + uVar7,"%s:%.*s",__s,(ulong)len,token);
        uVar7 = (ulong)(uint)(iVar3 + iVar6);
        uVar8 = (ulong)local_5c;
      }
    }
    else {
      mod = lyplg_type_identity_module
                      (local_40,(lysc_node *)0x0,token,(ulong)len,local_4c,resolve_prefix_data);
      if (((char)uVar8 != '\0') && (mod == (lys_module *)0x0)) {
        LVar2 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                           "Failed to resolve prefix \"%.*s\".",(ulong)len,token);
        goto LAB_001c456e;
      }
      if ((local_5d == '\0') || (*local_58 != mod)) {
        uVar9 = len;
        if (mod != (lys_module *)0x0) {
          token = lyplg_type_get_prefix(mod,get_format,get_prefix_data);
          if (token == (char *)0x0) {
            __assert_fail("prefix",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                          ,0x5d,
                          "LY_ERR lyplg_type_xpath10_print_token(const char *, uint16_t, ly_bool, const struct lys_module **, const struct ly_ctx *, LY_VALUE_FORMAT, const void *, LY_VALUE_FORMAT, void *, char **, struct ly_err_item **)"
                         );
          }
          sVar4 = strlen(token);
          uVar9 = (uint)sVar4;
        }
        pcVar5 = (char *)realloc(__ptr,(ulong)(uVar9 + iVar6 + 2));
        if (pcVar5 == (char *)0x0) {
LAB_001c4519:
          LVar2 = ly_err_new(err,LY_EMEM,LYVE_DATA,(char *)0x0,(char *)0x0,"No memory.");
          pcVar5 = __ptr;
          goto LAB_001c456e;
        }
        iVar3 = sprintf(pcVar5 + uVar7,"%.*s:",(ulong)uVar9,token);
        uVar7 = (ulong)(uint)(iVar3 + iVar6);
        uVar8 = (ulong)local_5c;
      }
      bVar1 = true;
      if ((char)uVar8 != '\0') {
        *local_58 = mod;
      }
    }
    token = str_next;
    LVar2 = ly_value_prefix_next(str_next,local_38,&len,&is_prefix,&str_next);
    if ((LVar2 != LY_SUCCESS) || (__ptr = pcVar5, len == 0)) goto LAB_001c456e;
  } while( true );
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_xpath10_print_token(const char *token, uint16_t tok_len, ly_bool is_nametest, const struct lys_module **context_mod,
        const struct ly_ctx *resolve_ctx, LY_VALUE_FORMAT resolve_format, const void *resolve_prefix_data,
        LY_VALUE_FORMAT get_format, void *get_prefix_data, char **token_p, struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    const char *str_begin, *str_next, *prefix;
    ly_bool is_prefix, has_prefix = 0;
    char *str = NULL;
    void *mem;
    uint32_t len, str_len = 0, pref_len;
    const struct lys_module *mod;

    str_begin = token;

    while (!(ret = ly_value_prefix_next(str_begin, token + tok_len, &len, &is_prefix, &str_next)) && len) {
        if (!is_prefix) {
            if (!has_prefix && is_nametest && (get_format == LY_VALUE_XML) && *context_mod) {
                /* get the prefix */
                prefix = lyplg_type_get_prefix(*context_mod, get_format, get_prefix_data);
                assert(prefix);

                /* append the nametest and prefix */
                mem = realloc(str, str_len + strlen(prefix) + 1 + len + 1);
                LY_CHECK_ERR_GOTO(!mem, ret = ly_err_new(err, LY_EMEM, LYVE_DATA, NULL, NULL, "No memory."), cleanup);
                str = mem;
                str_len += sprintf(str + str_len, "%s:%.*s", prefix, (int)len, str_begin);
            } else {
                /* just append the string, we may get the first expression node without a prefix but since this
                 * is not strictly forbidden, allow it */
                mem = realloc(str, str_len + len + 1);
                LY_CHECK_ERR_GOTO(!mem, ret = ly_err_new(err, LY_EMEM, LYVE_DATA, NULL, NULL, "No memory."), cleanup);
                str = mem;
                str_len += sprintf(str + str_len, "%.*s", (int)len, str_begin);
            }
        } else {
            /* remember there was a prefix found */
            has_prefix = 1;

            /* resolve the module in the original format */
            mod = lyplg_type_identity_module(resolve_ctx, NULL, str_begin, len, resolve_format, resolve_prefix_data);
            if (!mod && is_nametest) {
                ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Failed to resolve prefix \"%.*s\".",
                        (int)len, str_begin);
                goto cleanup;
            }

            if (is_nametest && ((get_format == LY_VALUE_JSON) || (get_format == LY_VALUE_LYB)) && (*context_mod == mod)) {
                /* inherit the prefix and do not print it again */
            } else {
                if (mod) {
                    /* get the prefix in the target format */
                    prefix = lyplg_type_get_prefix(mod, get_format, get_prefix_data);
                    assert(prefix);
                    pref_len = strlen(prefix);
                } else {
                    /* invalid prefix, just copy it */
                    prefix = str_begin;
                    pref_len = len;
                }

                /* append the prefix */
                mem = realloc(str, str_len + pref_len + 2);
                LY_CHECK_ERR_GOTO(!mem, ret = ly_err_new(err, LY_EMEM, LYVE_DATA, NULL, NULL, "No memory."), cleanup);
                str = mem;
                str_len += sprintf(str + str_len, "%.*s:", (int)pref_len, prefix);
            }

            if (is_nametest) {
                /* update context module */
                *context_mod = mod;
            }
        }

        str_begin = str_next;
    }

cleanup:
    if (ret) {
        free(str);
    } else {
        *token_p = str;
    }
    return ret;
}